

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_val *
duckdb_yyjson::unsafe_yyjson_ptr_getx(yyjson_val *val,char *ptr,size_t ptr_len,yyjson_ptr_err *err)

{
  int iVar1;
  yyjson_val *pyVar2;
  long lVar3;
  char *pcVar4;
  yyjson_ptr_code yVar5;
  byte *pbVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *__s2;
  byte bVar10;
  byte *pbVar11;
  byte *unaff_R13;
  ulong uVar12;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  long local_40;
  
  pbVar13 = (byte *)(ptr + ptr_len);
  pbVar11 = (byte *)ptr;
  do {
    __s2 = pbVar11 + 1;
    for (pbVar11 = __s2; ((pbVar11 < pbVar13 && (*pbVar11 != 0x2f)) && (*pbVar11 != 0x7e));
        pbVar11 = pbVar11 + 1) {
    }
    if ((pbVar11 == pbVar13) || (*pbVar11 != 0x7e)) {
      unaff_R13 = pbVar11 + -(long)__s2;
      local_40 = 0;
    }
    else {
      if (pbVar11 < pbVar13) {
        lVar3 = 0;
        do {
          pbVar8 = pbVar11 + 1;
          if (*pbVar11 == 0x2f) break;
          if (*pbVar11 == 0x7e) {
            if ((pbVar8 == pbVar13) || ((*pbVar8 & 0xfe) != 0x30)) {
              __s2 = (byte *)0x0;
              goto LAB_0124b277;
            }
            lVar3 = lVar3 + 1;
          }
          pbVar11 = pbVar8;
        } while (pbVar8 < pbVar13);
      }
      else {
        lVar3 = 0;
      }
      unaff_R13 = pbVar11 + (-(long)__s2 - lVar3);
      local_40 = lVar3;
    }
LAB_0124b277:
    if (__s2 == (byte *)0x0) {
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_val *)0x0;
      }
      pcVar4 = "invalid escaped character";
      yVar5 = 2;
      goto LAB_0124b503;
    }
    uVar12 = val->tag;
    if (((byte)uVar12 & 7) == 6) {
      if (uVar12 < 0x100) goto LAB_0124b2a1;
      if (unaff_R13 + -0x14 < (byte *)0xffffffffffffffed) {
        uVar7 = 0;
        bVar15 = false;
      }
      else if (*__s2 == 0x2d) {
        bVar15 = unaff_R13 < (byte *)0x2;
        uVar7 = -(ulong)bVar15;
      }
      else if (*__s2 == 0x30) {
        bVar15 = unaff_R13 < (byte *)0x2;
        uVar7 = 0;
      }
      else {
        bVar14 = (long)unaff_R13 < 1;
        if (((long)unaff_R13 < 1) || (uVar7 = (ulong)*__s2 - 0x30, 9 < uVar7)) {
          bVar15 = false;
          uVar7 = 0;
        }
        else {
          uVar9 = 0;
          pbVar8 = __s2;
          do {
            pbVar8 = pbVar8 + 1;
            uVar9 = uVar7 + uVar9 * 10;
            bVar14 = __s2 + (long)unaff_R13 <= pbVar8;
            uVar7 = uVar9;
            if (bVar14) goto LAB_0124b401;
            uVar7 = (ulong)*pbVar8 - 0x30;
          } while (uVar7 < 10);
          uVar7 = 0;
LAB_0124b401:
          bVar15 = uVar9 != 0;
        }
        bVar15 = (bool)(bVar15 & bVar14);
      }
      if (!bVar15) goto LAB_0124b2a1;
      pyVar2 = (yyjson_val *)0x0;
      if (uVar7 < uVar12 >> 8) {
        pyVar2 = val + 1;
        if ((uVar12 >> 4 & 0xfffffffffffffff0) + 0x10 == (val->uni).u64) {
          pyVar2 = pyVar2 + uVar7;
        }
        else {
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            pcVar4 = (char *)0x10;
            if ((~(uint)pyVar2->tag & 6) == 0) {
              pcVar4 = (pyVar2->uni).str;
            }
            pyVar2 = (yyjson_val *)(pcVar4 + (long)&pyVar2->tag);
          }
        }
      }
    }
    else {
      if ((((uint)uVar12 & 7) == 7) && (0xff < uVar12)) {
        uVar12 = uVar12 >> 8;
        do {
          if ((byte *)(val[1].tag >> 8) == unaff_R13) {
            if (local_40 == 0) {
              iVar1 = bcmp(val[1].uni.ptr,__s2,(size_t)unaff_R13);
              bVar15 = iVar1 == 0;
            }
            else {
              bVar15 = unaff_R13 == (byte *)0x0;
              if (unaff_R13 != (byte *)0x0) {
                pbVar6 = (byte *)0x0;
                pbVar8 = __s2;
                do {
                  if (*pbVar8 == 0x7e) {
                    bVar10 = 0x2f;
                    if (pbVar8[1] == 0x30) {
                      bVar10 = 0x7e;
                    }
                    if (bVar10 != val[1].uni.str[(long)pbVar6]) goto LAB_0124b325;
                    pbVar8 = pbVar8 + 1;
                  }
                  else if (val[1].uni.str[(long)pbVar6] != *pbVar8) goto LAB_0124b325;
                  pbVar8 = pbVar8 + 1;
                  pbVar6 = pbVar6 + 1;
                  bVar15 = unaff_R13 == pbVar6;
                } while (!bVar15);
              }
            }
            if (bVar15) {
              pyVar2 = val + 2;
              goto LAB_0124b461;
            }
          }
LAB_0124b325:
          pcVar4 = (char *)0x10;
          if ((~(uint)val[2].tag & 6) == 0) {
            pcVar4 = val[2].uni.str;
          }
          val = (yyjson_val *)(pcVar4 + (long)&val[1].tag);
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
LAB_0124b2a1:
      pyVar2 = (yyjson_val *)0x0;
    }
LAB_0124b461:
    if (pyVar2 == (yyjson_val *)0x0) {
      if (err == (yyjson_ptr_err *)0x0) {
        return (yyjson_val *)0x0;
      }
      pcVar4 = "JSON pointer cannot be resolved";
      yVar5 = 3;
      pbVar11 = __s2;
LAB_0124b503:
      err->code = yVar5;
      err->msg = pcVar4;
      err->pos = (long)pbVar11 - (long)ptr;
      return (yyjson_val *)0x0;
    }
    val = pyVar2;
    if (pbVar11 == pbVar13) {
      return pyVar2;
    }
  } while( true );
}

Assistant:

yyjson_val *unsafe_yyjson_ptr_getx(yyjson_val *val,
                                   const char *ptr, size_t ptr_len,
                                   yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_type type;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_obj_get(val, token, len, esc);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_arr_get(val, token, len, esc);
        } else {
            val = NULL;
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}